

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpBodySyntax::setChild(UdpBodySyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015bb01c + *(int *)(&DAT_015bb01c + in_RSI * 4)))();
  return;
}

Assistant:

void UdpBodySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: portDecls = child.node()->as<SeparatedSyntaxList<UdpPortDeclSyntax>>(); return;
        case 1: initialStmt = child.node() ? &child.node()->as<UdpInitialStmtSyntax>() : nullptr; return;
        case 2: table = child.token(); return;
        case 3: entries = child.node()->as<SyntaxList<UdpEntrySyntax>>(); return;
        case 4: endtable = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}